

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O2

spv_result_t spvtools::val::ModeSettingPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  pointer psVar4;
  pointer psVar5;
  pointer pIVar6;
  bool bVar7;
  uint16_t uVar8;
  uint uVar9;
  ExecutionModel EVar10;
  uint id;
  int32_t iVar11;
  MemoryModel MVar12;
  AddressingModel AVar13;
  Decoration DVar14;
  BuiltIn BVar15;
  ExecutionMode EVar16;
  Instruction *pIVar17;
  Instruction *pIVar18;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *psVar19;
  size_type sVar20;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var21;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar22;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  spv_result_t sVar25;
  Capability CVar26;
  char *pcVar27;
  difference_type __n;
  long lVar28;
  ulong uVar29;
  Instruction *i;
  pointer this;
  string local_248;
  uint entry_point_id;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  uVar8 = (inst->inst_).opcode;
  if (uVar8 == 0xe) {
    MVar12 = ValidationState_t::memory_model(_);
    if ((MVar12 == Vulkan) ||
       (bVar7 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityVulkanMemoryModel), !bVar7)) {
      bVar7 = spvIsOpenCLEnv(_->context_->target_env);
      if (!bVar7) {
LAB_001d66b1:
        bVar7 = spvIsVulkanEnv(_->context_->target_env);
        if (((bVar7) && (AVar13 = ValidationState_t::addressing_model(_), AVar13 != Logical)) &&
           (AVar13 = ValidationState_t::addressing_model(_), AVar13 != PhysicalStorageBuffer64)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x121b,(char *)0x0);
          std::operator<<((ostream *)local_208,(string *)&local_248);
          std::operator<<((ostream *)local_208,
                          "Addressing model must be Logical or PhysicalStorageBuffer64 ");
          pcVar27 = "in the Vulkan environment.";
          goto LAB_001d677f;
        }
        goto LAB_001d707c;
      }
      AVar13 = ValidationState_t::addressing_model(_);
      if ((AVar13 == Physical32) ||
         (AVar13 = ValidationState_t::addressing_model(_), AVar13 == Physical64)) {
        MVar12 = ValidationState_t::memory_model(_);
        if (MVar12 == OpenCL) goto LAB_001d66b1;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = "Memory model must be OpenCL in the OpenCL environment.";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)local_208,"Addressing model must be Physical32 or Physical64 ");
        pcVar27 = "in the OpenCL environment.";
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = 
      "VulkanMemoryModelKHR capability must only be specified if the VulkanKHR memory model is used."
      ;
    }
    goto LAB_001d7061;
  }
  if ((uVar8 == 0x14b) || (uVar8 == 0x10)) {
    entry_point_id = Instruction::GetOperandAs<unsigned_int>(inst,0);
    _Var21 = std::
             __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                       ((_->entry_points_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (_->entry_points_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    if (_Var21._M_current ==
        (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)local_208,"OpExecutionMode Entry Point <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_248,_,entry_point_id);
      std::operator<<((ostream *)local_208,(string *)&local_248);
      pcVar27 = " is not the Entry Point operand of an OpEntryPoint.";
      goto LAB_001d677f;
    }
    EVar16 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1);
    if ((inst->inst_).opcode == 0x14b) {
      if (((EVar16 - ExecutionModeSubgroupsPerWorkgroupId < 3) ||
          (EVar16 == ExecutionModeFPFastMathDefault)) ||
         (EVar16 == ExecutionModeMaximumRegistersIdINTEL)) {
        psVar4 = (inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        psVar5 = (inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        for (uVar29 = 2; uVar29 < (ulong)((long)psVar4 - (long)psVar5 >> 4); uVar29 = uVar29 + 1) {
          uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,uVar29);
          pIVar17 = ValidationState_t::FindDef(_,uVar9);
          if (EVar16 - ExecutionModeSubgroupsPerWorkgroupId < 3) {
            iVar11 = spvOpcodeIsConstant((uint)(pIVar17->inst_).opcode);
            if (iVar11 == 0) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              pcVar27 = "For OpExecutionModeId all Extra Operand ids must be constant instructions."
              ;
              goto LAB_001d7061;
            }
          }
          else if (EVar16 == ExecutionModeFPFastMathDefault) {
            if (uVar29 == 2) {
              bVar7 = ValidationState_t::IsFloatScalarType(_,uVar9);
              if (!bVar7) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar27 = "The Target Type operand must be a floating-point scalar type";
                goto LAB_001d7061;
              }
            }
            else {
              ValidationState_t::EvalInt32IfConst
                        ((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar9);
              if ((local_203 != '\x01') || (local_208[4] == false)) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar27 = "The Fast Math Default operand must be a non-specialization constant";
                goto LAB_001d7061;
              }
              if (0x7ffff < (uint)local_208._0_4_) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar27 = "The Fast Math Default operand is an invalid bitmask value";
                goto LAB_001d7061;
              }
              if ((local_208._0_4_ & DepthUnchanged) != ExecutionModeInvocations) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar27 = "The Fast Math Default operand must not include Fast";
                goto LAB_001d7061;
              }
              if ((~local_208._0_4_ & 0x30000) != 0 && 0x3ffff < (uint)local_208._0_4_) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                pcVar27 = 
                "The Fast Math Default operand must include AllowContract and AllowReassoc when AllowTransform is specified"
                ;
                goto LAB_001d7061;
              }
            }
          }
        }
LAB_001d67ce:
        psVar22 = ValidationState_t::GetExecutionModels(_,entry_point_id);
        switch(EVar16) {
        case ExecutionModeInvocations:
        case ExecutionModeInputPoints:
        case ExecutionModeInputLines:
        case ExecutionModeInputLinesAdjacency:
        case ExecutionModeInputTrianglesAdjacency:
        case ExecutionModeOutputLineStrip:
        case ExecutionModeOutputTriangleStrip:
          for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            if (p_Var24[1]._M_color != 3) goto LAB_001d7044;
          }
          break;
        case ExecutionModeSpacingEqual:
        case ExecutionModeSpacingFractionalEven:
        case ExecutionModeSpacingFractionalOdd:
        case ExecutionModeVertexOrderCw:
        case ExecutionModeVertexOrderCcw:
        case ExecutionModePointMode:
        case ExecutionModeQuads:
        case ExecutionModeIsolines:
          for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            if (p_Var24[1]._M_color - 3 < 0xfffffffe) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = "Execution mode can only be used with a tessellation execution model.";
              goto LAB_001d7061;
            }
          }
          break;
        case ExecutionModePixelCenterInteger:
        case ExecutionModeOriginUpperLeft:
        case ExecutionModeOriginLowerLeft:
        case EarlyFragmentTests:
        case DepthReplacing:
        case DepthGreater:
        case DepthLess:
        case DepthUnchanged:
switchD_001d67f8_caseD_6:
          for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            if (p_Var24[1]._M_color != 4) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = "Execution mode can only be used with the Fragment execution model.";
              goto LAB_001d7061;
            }
          }
          break;
        case ExecutionModeXfb:
        case DepthReplacing|ExecutionModeSpacingEqual:
        case 0x20:
        case ExecutionModeInitializer:
        case ExecutionModeFinalizer:
        case ExecutionModeSubgroupSize:
        case ExecutionModeSubgroupsPerWorkgroup:
        case ExecutionModeSubgroupsPerWorkgroupId:
          break;
        case ExecutionModeLocalSize:
        case ExecutionModeLocalSizeId:
          if (((EVar16 == ExecutionModeLocalSizeId) &&
              ((_->features_).env_allow_localsizeid == false)) &&
             (_->options_->allow_localsizeid == false)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = "LocalSizeId mode is not allowed by the current environment.";
            goto LAB_001d7061;
          }
          pCVar1 = &_->module_capabilities_;
          for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            _Var3 = p_Var24[1]._M_color;
            if (1 < _Var3 - 5) {
              if (_Var3 - 0x1493 < 2) {
                CVar26 = CapabilityMeshShadingNV;
LAB_001d6c1f:
                bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CVar26);
                if (bVar7) goto LAB_001d6c2c;
              }
              else if (_Var3 - 0x14f4 < 2) {
                CVar26 = CapabilityMeshShadingEXT;
                goto LAB_001d6c1f;
              }
              bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingNV);
              if ((bVar7) ||
                 (bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingEXT), bVar7
                 )) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar27 = 
                "Execution mode can only be used with a Kernel, GLCompute, MeshNV, MeshEXT, TaskNV or TaskEXT execution model."
                ;
              }
              else {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar27 = 
                "Execution mode can only be used with a Kernel or GLCompute execution model.";
              }
              goto LAB_001d7061;
            }
LAB_001d6c2c:
          }
          break;
        case ExecutionModeLocalSizeHint:
        case ExecutionModeVecTypeHint:
        case ContractionOff:
        case ExecutionModeLocalSizeHintId:
          for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            if (p_Var24[1]._M_color != 6) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = "Execution mode can only be used with the Kernel execution model.";
              goto LAB_001d7061;
            }
          }
          break;
        case ExecutionModeTriangles:
          for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            if (p_Var24[1]._M_color - 4 < 0xfffffffd) goto LAB_001d71f8;
          }
          break;
        case ExecutionModeOutputVertices:
          pCVar1 = &_->module_capabilities_;
          for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            _Var3 = p_Var24[1]._M_color;
            if (2 < _Var3 - _S_black) {
              if (_Var3 == 0x1494) {
                CVar26 = CapabilityMeshShadingNV;
LAB_001d6d65:
                bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CVar26);
                if (bVar7) goto LAB_001d6d72;
              }
              else if (_Var3 == 0x14f5) {
                CVar26 = CapabilityMeshShadingEXT;
                goto LAB_001d6d65;
              }
              bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingNV);
              if ((!bVar7) &&
                 (bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingEXT),
                 !bVar7)) goto LAB_001d71f8;
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = 
              "Execution mode can only be used with a Geometry, tessellation, MeshNV or MeshEXT execution model."
              ;
              goto LAB_001d7061;
            }
LAB_001d6d72:
          }
          break;
        case ExecutionModeOutputPoints:
          pCVar1 = &_->module_capabilities_;
          for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            _Var3 = p_Var24[1]._M_color;
            if (_Var3 != 3) {
              if (_Var3 == 0x1494) {
                CVar26 = CapabilityMeshShadingNV;
LAB_001d6d07:
                bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CVar26);
                if (bVar7) goto LAB_001d6d14;
              }
              else if (_Var3 == 0x14f5) {
                CVar26 = CapabilityMeshShadingEXT;
                goto LAB_001d6d07;
              }
              bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingNV);
              if ((!bVar7) &&
                 (bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingEXT),
                 !bVar7)) goto LAB_001d7044;
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = 
              "Execution mode can only be used with the Geometry MeshNV or MeshEXT execution model."
              ;
              goto LAB_001d7061;
            }
LAB_001d6d14:
          }
          break;
        default:
          if (((EVar16 - ExecutionModeStencilRefUnchangedFrontAMD < 6) ||
              (EVar16 - ExecutionModePixelInterlockOrderedEXT < 6)) ||
             (EVar16 - ExecutionModeNonCoherentColorAttachmentReadEXT < 3))
          goto switchD_001d67f8_caseD_6;
          if ((EVar16 - ExecutionModeOutputLinesEXT < 0x1e) &&
             ((0x20000003U >> (EVar16 - ExecutionModeOutputLinesEXT & 0x1f) & 1) != 0)) {
            for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
                p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
              if ((p_Var24[1]._M_color != 0x14f5) && (p_Var24[1]._M_color != 0x1494)) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar27 = 
                "Execution mode can only be used with the MeshEXT or MeshNV execution model.";
                goto LAB_001d7061;
              }
            }
          }
          else {
            if (EVar16 == EarlyAndLateFragmentTestsAMD) goto switchD_001d67f8_caseD_6;
            if (EVar16 == ExecutionModeQuadDerivativesKHR) {
              for (p_Var24 = (psVar22->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var24 != &(psVar22->_M_t)._M_impl.super__Rb_tree_header;
                  p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
                if ((p_Var24[1]._M_color & ~_S_black) != 4) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar27 = 
                  "Execution mode can only be used with the Fragment or GLCompute execution model.";
                  goto LAB_001d7061;
                }
              }
            }
            else if (EVar16 == ExecutionModeRequireFullQuadsKHR) goto switchD_001d67f8_caseD_6;
          }
        }
        if ((EVar16 != ExecutionModeFPFastMathDefault) ||
           (psVar19 = ValidationState_t::GetExecutionModes(_,entry_point_id),
           psVar19 ==
           (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
            *)0x0)) {
LAB_001d6e3b:
          bVar7 = spvIsVulkanEnv(_->context_->target_env);
          if (!bVar7) goto LAB_001d707c;
          if (EVar16 == ExecutionModePixelCenterInteger) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x122e,(char *)0x0);
            std::operator<<((ostream *)local_208,(string *)&local_248);
            pcVar27 = 
            "In the Vulkan environment, the PixelCenterInteger execution mode must not be used.";
          }
          else {
            if (EVar16 != ExecutionModeOriginLowerLeft) goto LAB_001d707c;
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x122d,(char *)0x0);
            std::operator<<((ostream *)local_208,(string *)&local_248);
            pcVar27 = 
            "In the Vulkan environment, the OriginLowerLeft execution mode must not be used.";
          }
LAB_001d677f:
          std::operator<<((ostream *)local_208,pcVar27);
          sVar25 = local_38;
          goto LAB_001d678e;
        }
        local_208._0_4_ = 0x1f;
        sVar20 = std::
                 set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 ::count(psVar19,(key_type *)local_208);
        if (sVar20 == 0) {
          local_208._0_4_ = 0x116d;
          sVar20 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(psVar19,(key_type *)local_208);
          if (sVar20 == 0) goto LAB_001d6e3b;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = 
          "FPFastMathDefault and SignedZeroInfNanPreserve execution modes cannot be applied to the same entry point"
          ;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = 
          "FPFastMathDefault and ContractionOff execution modes cannot be applied to the same entry point"
          ;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar27 = 
        "OpExecutionModeId is only valid when the Mode operand is an execution mode that takes Extra Operands that are id operands."
        ;
      }
    }
    else {
      if ((2 < EVar16 - ExecutionModeSubgroupsPerWorkgroupId) &&
         (EVar16 != ExecutionModeFPFastMathDefault)) goto LAB_001d67ce;
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = 
      "OpExecutionMode is only valid when the Mode operand is an execution mode that takes no Extra Operands, or takes Extra Operands that are not id operands."
      ;
    }
    goto LAB_001d7061;
  }
  if (uVar8 != 0xf) goto LAB_001d707c;
  uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
  pIVar17 = ValidationState_t::FindDef(_,uVar9);
  if ((pIVar17 == (Instruction *)0x0) || ((pIVar17->inst_).opcode != 0x36)) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"OpEntryPoint Entry Point <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&local_248,_,uVar9);
    std::operator<<((ostream *)local_208,(string *)&local_248);
    pcVar27 = " is not a function.";
    goto LAB_001d677f;
  }
  EVar10 = Instruction::GetOperandAs<spv::ExecutionModel>(inst,0);
  if (EVar10 != ExecutionModelKernel) {
    id = Instruction::GetOperandAs<unsigned_int>(pIVar17,3);
    pIVar18 = ValidationState_t::FindDef(_,id);
    if ((pIVar18 != (Instruction *)0x0) &&
       ((long)(pIVar18->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(pIVar18->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start == 0xc)) goto LAB_001d63d5;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x1219,(char *)0x0);
    std::operator<<((ostream *)local_208,(string *)&local_248);
    std::operator<<((ostream *)local_208,"OpEntryPoint Entry Point <id> ");
    ValidationState_t::getIdName_abi_cxx11_((string *)&entry_point_id,_,uVar9);
    std::operator<<((ostream *)local_208,(string *)&entry_point_id);
    pcVar27 = "s function parameter count is not zero.";
LAB_001d69c5:
    std::operator<<((ostream *)local_208,pcVar27);
    std::__cxx11::string::_M_dispose();
    sVar25 = local_38;
LAB_001d678e:
    std::__cxx11::string::_M_dispose();
    goto LAB_001d7070;
  }
LAB_001d63d5:
  pIVar17 = ValidationState_t::FindDef(_,(pIVar17->inst_).type_id);
  if ((pIVar17 == (Instruction *)0x0) || ((pIVar17->inst_).opcode != 0x13)) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x1219,(char *)0x0);
    std::operator<<((ostream *)local_208,(string *)&local_248);
    std::operator<<((ostream *)local_208,"OpEntryPoint Entry Point <id> ");
    ValidationState_t::getIdName_abi_cxx11_((string *)&entry_point_id,_,uVar9);
    std::operator<<((ostream *)local_208,(string *)&entry_point_id);
    pcVar27 = "s function return type is not void.";
    goto LAB_001d69c5;
  }
  psVar19 = ValidationState_t::GetExecutionModes(_,uVar9);
  bVar7 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
  if (bVar7) {
    if (EVar10 - ExecutionModelTessellationControl < 2) {
      if (psVar19 ==
          (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
           *)0x0) goto LAB_001d7379;
      p_Var2 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
      uVar29 = 0;
      p_Var24 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var23 = p_Var24; (_Rb_tree_header *)p_Var23 != p_Var2;
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
        uVar29 = uVar29 + (p_Var23[1]._M_color - _S_black < 3);
      }
      if (uVar29 < 2) {
        lVar28 = 0;
        for (p_Var23 = p_Var24; (_Rb_tree_header *)p_Var23 != p_Var2;
            p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
          if ((p_Var23[1]._M_color < 0x1a) &&
             ((0x3400000U >> (p_Var23[1]._M_color & 0x1f) & 1) != 0)) {
            lVar28 = lVar28 + 1;
          }
        }
        if (lVar28 < 2) {
          uVar29 = 0;
          for (; (_Rb_tree_header *)p_Var24 != p_Var2;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            uVar29 = uVar29 + ((p_Var24[1]._M_color & ~_S_black) == 4);
          }
          if (uVar29 < 2) goto LAB_001d7379;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = 
          "Tessellation execution model entry points can specify at most one of VertexOrderCw or VertexOrderCcw execution modes."
          ;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = 
          "Tessellation execution model entry points can specify at most one of Triangles, Quads or Isolines execution modes."
          ;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = 
        "Tessellation execution model entry points can specify at most one of SpacingEqual, SpacingFractionalOdd or SpacingFractionalEven execution modes."
        ;
      }
    }
    else if (EVar10 == ExecutionModelGeometry) {
      if (psVar19 !=
          (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
           *)0x0) {
        p_Var2 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
        lVar28 = 0;
        p_Var24 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var23 = p_Var24; (_Rb_tree_header *)p_Var23 != p_Var2;
            p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
          lVar28 = lVar28 + (ulong)(p_Var23[1]._M_color - 0x13 < 5);
        }
        if (lVar28 == 1) {
          lVar28 = 0;
          for (; (_Rb_tree_header *)p_Var24 != p_Var2;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            lVar28 = lVar28 + (ulong)(p_Var24[1]._M_color - 0x1b < 3);
          }
          if (lVar28 != 1) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = 
            "Geometry execution model entry points must specify exactly one of OutputPoints, OutputLineStrip or OutputTriangleStrip execution modes."
            ;
            goto LAB_001d7061;
          }
          goto LAB_001d7379;
        }
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = 
      "Geometry execution model entry points must specify exactly one of InputPoints, InputLines, InputLinesAdjacency, Triangles or InputTrianglesAdjacency execution modes."
      ;
    }
    else if (EVar10 == ExecutionModelMeshEXT) {
      if (psVar19 !=
          (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
           *)0x0) {
        p_Var2 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
        lVar28 = 0;
        p_Var24 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var23 = p_Var24; (_Rb_tree_header *)p_Var23 != p_Var2;
            p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
          _Var3 = p_Var23[1]._M_color;
          if (((_Var3 == 0x1b) || (_Var3 == 0x14b2)) || (_Var3 == 0x1495)) {
            lVar28 = lVar28 + 1;
          }
        }
        if (lVar28 == 1) {
          lVar28 = 0;
          for (; (_Rb_tree_header *)p_Var24 != p_Var2;
              p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
            lVar28 = lVar28 + (ulong)(p_Var24[1]._M_color == 0x1a || p_Var24[1]._M_color == 0x1496);
          }
          if (lVar28 != 2) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = 
            "MeshEXT execution model entry points must specify both OutputPrimitivesEXT and OutputVertices Execution Modes."
            ;
            goto LAB_001d7061;
          }
          goto LAB_001d7379;
        }
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar27 = 
      "MeshEXT execution model entry points must specify exactly one of OutputPoints, OutputLinesEXT, or OutputTrianglesEXT Execution Modes."
      ;
    }
    else {
      if (EVar10 != ExecutionModelFragment) goto LAB_001d7379;
      if (psVar19 ==
          (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
           *)0x0) {
LAB_001d727c:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar27 = 
        "Fragment execution model entry points require either an OriginUpperLeft or OriginLowerLeft execution mode."
        ;
      }
      else {
        local_208._0_4_ = 7;
        sVar20 = std::
                 set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 ::count(psVar19,(key_type *)local_208);
        if (sVar20 != 0) {
          local_248._M_dataplus._M_p._0_4_ = 8;
          sVar20 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(psVar19,(key_type *)&local_248);
          if (sVar20 != 0) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = 
            "Fragment execution model entry points can only specify one of OriginUpperLeft or OriginLowerLeft execution modes."
            ;
            goto LAB_001d7061;
          }
        }
        local_208._0_4_ = 7;
        sVar20 = std::
                 set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 ::count(psVar19,(key_type *)local_208);
        if (sVar20 == 0) {
          local_248._M_dataplus._M_p._0_4_ = 8;
          sVar20 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(psVar19,(key_type *)&local_248);
          if (sVar20 == 0) goto LAB_001d727c;
        }
        p_Var2 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
        uVar29 = 0;
        p_Var24 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var23 = p_Var24; (_Rb_tree_header *)p_Var23 != p_Var2;
            p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
          uVar29 = uVar29 + (p_Var23[1]._M_color - 0xe < 3);
        }
        if (uVar29 < 2) {
          uVar29 = 0;
          for (p_Var23 = p_Var24; (_Rb_tree_header *)p_Var23 != p_Var2;
              p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
            uVar29 = uVar29 + (p_Var23[1]._M_color - 0x14f6 < 6);
          }
          if (uVar29 < 2) {
            uVar29 = 0;
            for (p_Var23 = p_Var24; (_Rb_tree_header *)p_Var23 != p_Var2;
                p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
              uVar29 = uVar29 + (p_Var23[1]._M_color - 0x13d7 < 3);
            }
            if (uVar29 < 2) {
              uVar29 = 0;
              for (; (_Rb_tree_header *)p_Var24 != p_Var2;
                  p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24)) {
                uVar29 = uVar29 + (p_Var24[1]._M_color - 0x13da < 3);
              }
              if (uVar29 < 2) goto LAB_001d7379;
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = 
              "Fragment execution model entry points can specify at most one of StencilRefUnchangedBackAMD, StencilRefLessBackAMD or StencilRefGreaterBackAMD execution modes."
              ;
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar27 = 
              "Fragment execution model entry points can specify at most one of StencilRefUnchangedFrontAMD, StencilRefLessFrontAMD or StencilRefGreaterFrontAMD execution modes."
              ;
            }
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar27 = 
            "Fragment execution model entry points can specify at most one fragment shader interlock execution mode."
            ;
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar27 = 
          "Fragment execution model entry points can specify at most one of DepthGreater, DepthLess or DepthUnchanged execution modes."
          ;
        }
      }
    }
    goto LAB_001d7061;
  }
LAB_001d7379:
  bVar7 = spvIsVulkanEnv(_->context_->target_env);
  if ((EVar10 == ExecutionModelGLCompute) && (bVar7)) {
    if (psVar19 !=
        (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
         *)0x0) {
      local_208._0_4_ = 0x11;
      sVar20 = std::
               set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               ::count(psVar19,(key_type *)local_208);
      if (sVar20 != 0) goto LAB_001d707c;
    }
    pIVar6 = (_->ordered_instructions_).
             super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this = (_->ordered_instructions_).
                super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_start; this != pIVar6; this = this + 1) {
      uVar8 = (this->inst_).opcode;
      if (uVar8 == 0x47) {
        if (((0x20 < (ulong)((long)(this->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) &&
            (DVar14 = Instruction::GetOperandAs<spv::Decoration>(this,1), DVar14 == BuiltIn)) &&
           (BVar15 = Instruction::GetOperandAs<spv::BuiltIn>(this,2), BVar15 == BuiltInWorkgroupSize
           )) goto LAB_001d707c;
        uVar8 = (this->inst_).opcode;
      }
      if ((uVar8 == 0x14b) &&
         (EVar16 = Instruction::GetOperandAs<spv::ExecutionMode>(this,1),
         EVar16 == ExecutionModeLocalSizeId)) goto LAB_001d707c;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x191a,(char *)0x0);
    std::operator<<((ostream *)local_208,(string *)&local_248);
    pcVar27 = 
    "In the Vulkan environment, GLCompute execution model entry points require either the LocalSize or LocalSizeId execution mode or an object decorated with WorkgroupSize must be specified."
    ;
    goto LAB_001d677f;
  }
  goto LAB_001d707c;
LAB_001d71f8:
  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
  pcVar27 = "Execution mode can only be used with a Geometry or tessellation execution model.";
  goto LAB_001d7061;
LAB_001d7044:
  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
  pcVar27 = "Execution mode can only be used with the Geometry execution model.";
LAB_001d7061:
  std::operator<<((ostream *)local_208,pcVar27);
  sVar25 = local_38;
LAB_001d7070:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  if (sVar25 == SPV_SUCCESS) {
LAB_001d707c:
    sVar25 = SPV_SUCCESS;
  }
  return sVar25;
}

Assistant:

spv_result_t ModeSettingPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpEntryPoint:
      if (auto error = ValidateEntryPoint(_, inst)) return error;
      break;
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
      if (auto error = ValidateExecutionMode(_, inst)) return error;
      break;
    case spv::Op::OpMemoryModel:
      if (auto error = ValidateMemoryModel(_, inst)) return error;
      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}